

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall
FIX::DataDictionary::addValueName(DataDictionary *this,int field,string *value,string *name)

{
  string *psVar1;
  mapped_type *pmVar2;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string *local_28;
  string *name_local;
  string *value_local;
  DataDictionary *pDStack_10;
  int field_local;
  DataDictionary *this_local;
  
  local_28 = name;
  name_local = value;
  value_local._4_4_ = field;
  pDStack_10 = this;
  std::make_pair<int&,std::__cxx11::string_const&>(&local_50,(int *)((long)&value_local + 4),value);
  pmVar2 = std::
           map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_valueNames,&local_50);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)name);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair(&local_50);
  psVar1 = name_local;
  std::make_pair<int&,std::__cxx11::string_const&>
            (&local_88,(int *)((long)&value_local + 4),local_28);
  pmVar2 = std::
           map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_nameValues,&local_88);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)psVar1);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair(&local_88);
  return;
}

Assistant:

void addValueName(int field, const std::string &value, const std::string &name) {
    m_valueNames[std::make_pair(field, value)] = name;
    m_nameValues[std::make_pair(field, name)] = value;
  }